

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Reader.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::BP4Reader::ProcessMetadataForNewSteps(BP4Reader *this,size_t newIdxSize)

{
  size_t sVar1;
  long in_RDI;
  Engine *unaff_retaddr;
  size_t newProcessedMDSize;
  undefined1 in_stack_0000025e;
  undefined1 in_stack_0000025f;
  size_t in_stack_00000260;
  BufferSTL *in_stack_00000268;
  BP4Deserializer *in_stack_00000270;
  undefined1 in_stack_000002df;
  Engine *in_stack_000002e0;
  BufferSTL *in_stack_000002e8;
  BP4Deserializer *in_stack_000002f0;
  
  Engine::RemoveCreatedVars(unaff_retaddr);
  adios2::format::BP4Deserializer::ParseMetadataIndex
            (in_stack_00000270,in_stack_00000268,in_stack_00000260,(bool)in_stack_0000025f,
             (bool)in_stack_0000025e);
  *(undefined1 *)(in_RDI + 0x761) = 1;
  sVar1 = adios2::format::BP4Deserializer::ParseMetadata
                    (in_stack_000002f0,in_stack_000002e8,in_stack_000002e0,(bool)in_stack_000002df);
  *(size_t *)(in_RDI + 0x648) = *(long *)(in_RDI + 0x650) + sVar1;
  return;
}

Assistant:

void BP4Reader::ProcessMetadataForNewSteps(const size_t newIdxSize)
{
    /* Remove all variables we created in the last step */
    RemoveCreatedVars();

    /* Parse metadata index table (without header) */
    /* We need to skew the index table pointers with the
       size of the already-processed metadata because the memory buffer of
       new metadata starts from 0 */
    m_BP4Deserializer.ParseMetadataIndex(m_BP4Deserializer.m_MetadataIndex, m_MDFileAbsolutePos,
                                         !m_IdxHeaderParsed, true);
    m_IdxHeaderParsed = true;

    // fills IO with Variables and Attributes
    const size_t newProcessedMDSize =
        m_BP4Deserializer.ParseMetadata(m_BP4Deserializer.m_Metadata, *this, false);

    // remember current end position in metadata and index table for next round
    m_MDFileProcessedSize = m_MDFileAbsolutePos + newProcessedMDSize;
    // if (m_BP4Deserializer.m_RankMPI == 0)
    //{
    //    m_MDIndexFileAlreadyReadSize += newIdxSize;
    //}
}